

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_fax3.c
# Opt level: O3

int TIFFInitCCITTFax4(TIFF *tif,int scheme)

{
  int iVar1;
  
  iVar1 = InitCCITTFax3(tif);
  if (iVar1 != 0) {
    iVar1 = _TIFFMergeFields(tif,fax4Fields,1);
    if (iVar1 != 0) {
      tif->tif_decoderow = Fax4Decode;
      tif->tif_decodestrip = Fax4Decode;
      tif->tif_decodetile = Fax4Decode;
      tif->tif_encoderow = Fax4Encode;
      tif->tif_encodestrip = Fax4Encode;
      tif->tif_encodetile = Fax4Encode;
      tif->tif_postencode = Fax4PostEncode;
      iVar1 = TIFFSetField(tif,0x10000,1);
      return iVar1;
    }
    TIFFErrorExtR(tif,"TIFFInitCCITTFax4","Merging CCITT Fax 4 codec-specific tags failed");
  }
  return 0;
}

Assistant:

int TIFFInitCCITTFax4(TIFF *tif, int scheme)
{
    (void)scheme;
    if (InitCCITTFax3(tif))
    { /* reuse G3 support */
        /*
         * Merge codec-specific tag information.
         */
        if (!_TIFFMergeFields(tif, fax4Fields, TIFFArrayCount(fax4Fields)))
        {
            TIFFErrorExtR(tif, "TIFFInitCCITTFax4",
                          "Merging CCITT Fax 4 codec-specific tags failed");
            return 0;
        }

        tif->tif_decoderow = Fax4Decode;
        tif->tif_decodestrip = Fax4Decode;
        tif->tif_decodetile = Fax4Decode;
        tif->tif_encoderow = Fax4Encode;
        tif->tif_encodestrip = Fax4Encode;
        tif->tif_encodetile = Fax4Encode;
        tif->tif_postencode = Fax4PostEncode;
        /*
         * Suppress RTC at the end of each strip.
         */
        return TIFFSetField(tif, TIFFTAG_FAXMODE, FAXMODE_NORTC);
    }
    else
        return (0);
}